

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O1

void __thiscall
PP_el_hahn::monochromaticDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,double dw,bool rotFrame)

{
  C_matrix<double> *this_00;
  C_matrix<double> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  ostream *poVar8;
  double *pdVar9;
  undefined7 in_register_00000031;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  dVar1 = (this->super_PP_sigRMN).Bz0;
  dVar2 = (this->super_PP_sigRMN).Bxy;
  dVar3 = (this->super_PP_sigRMN).muz0;
  dVar12 = (this->super_PP_sigRMN).T1;
  dVar4 = (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = (dw / (dVar1 * dVar4) + 1.0) * dVar3;
  (this->super_PP_sigRMN).Bz0 = dw / dVar4 + dVar1;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar4 = (this->super_PP_sigRMN).T2;
  if (dVar12 <= dVar4) {
    dVar12 = dVar4;
  }
  (this->super_PP_sigRMN).sigLength = 200;
  dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,mx0,my0,mz0,dVar12 / 200.0,dw);
  dVar10 = dVar10 + 0.0;
  this_00 = &(this->super_PP_sigRMN).MU;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar4 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar5 = *pdVar7;
  if ((int)CONCAT71(in_register_00000031,rotFrame) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar10);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"initSig.txt","");
  C_matrix<double>::save(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_01 = &(this->super_PP_sigRMN).T;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"initSigTime.txt","");
  C_matrix<double>::save(this_01,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  dVar11 = (this->super_PP_sigRMN).gamma;
  dVar13 = dw / dVar11 + dVar1;
  (this->super_PP_sigRMN).Bz0 = dVar13;
  (this->super_PP_sigRMN).Bxy = dVar2;
  (this->super_PP_sigRMN).omega = dVar13 * dVar11;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar11 = PP_sigRMN::generateRMNsignal
                     (&this->super_PP_sigRMN,dVar12,dVar4,dVar5,(this->super_PP_sigRMN).tw / 4000.0,
                      dw);
  dVar11 = dVar11 + dVar10;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar4 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar5 = *pdVar7;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar11);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"p90.txt","");
  C_matrix<double>::save(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"p90Time.txt","");
  C_matrix<double>::save(this_01,&local_b0);
  pdVar7 = &(this->super_PP_sigRMN).Bxy;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  (this->super_PP_sigRMN).Bz0 = dw / (this->super_PP_sigRMN).gamma + dVar1;
  *pdVar7 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar12,dVar4,dVar5,
                      ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,dw);
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar4 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar5 = *pdVar9;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar10 + dVar11);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"fid.txt","");
  C_matrix<double>::save(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"fidTime.txt","");
  C_matrix<double>::save(this_01,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  dVar13 = (this->super_PP_sigRMN).gamma;
  dVar6 = (this->super_PP_sigRMN).tw;
  dVar14 = dw / dVar13 + dVar1;
  (this->super_PP_sigRMN).Bz0 = dVar14;
  (this->super_PP_sigRMN).Bxy = dVar2;
  (this->super_PP_sigRMN).omega = dVar14 * dVar13;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar13 = PP_sigRMN::generateRMNsignal
                     (&this->super_PP_sigRMN,dVar12,dVar4,dVar5,(dVar6 + dVar6) / 4000.0,dw);
  dVar13 = dVar10 + dVar11 + dVar13;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar4 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar5 = *pdVar9;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar13);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"p180.txt","");
  C_matrix<double>::save(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"p180Time.txt","");
  C_matrix<double>::save(this_01,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  (this->super_PP_sigRMN).Bz0 = dw / (this->super_PP_sigRMN).gamma + dVar1;
  *pdVar7 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 2000;
  dVar12 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar12,dVar4,dVar5,
                      ((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) / 2000.0,dw);
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar13 + dVar12);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"spinEcho.txt","");
  C_matrix<double>::save(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"spinEchoTime.txt","");
  C_matrix<double>::save(this_01,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  (this->super_PP_sigRMN).Bz0 = dVar1;
  (this->super_PP_sigRMN).Bxy = dVar2;
  (this->super_PP_sigRMN).omega = dVar1 * (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = dVar3;
  return;
}

Assistant:

void PP_el_hahn::monochromaticDiffusion(double mx0, double my0, double mz0, double dw, bool rotFrame)
{
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;
    double tempMuz0=muz0;
    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("initSig.txt");
    T.save("initSigTime.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    //t90 = Pi/(2.0*gamma*Bxy);
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p90.txt");
    T.save("p90Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);
    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("fid.txt");
    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=2.0*tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p180.txt");
    T.save("p180Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=2000;
    dt=(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MU.save("spinEcho.txt");
    T.save("spinEchoTime.txt");

    //restore the parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    return;
    return;
}